

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalFileSecretStorage::RemoveSecret
          (LocalFileSecretStorage *this,string *secret,OnEntryNotFound on_entry_not_found)

{
  pointer pcVar1;
  LocalFileSystem fs;
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FileSystem local_138;
  string local_130 [4];
  string local_b0 [4];
  
  local_138._vptr_FileSystem = (_func_int **)&PTR__FileSystem_02454f98;
  pcVar1 = (secret->_M_dataplus)._M_p;
  local_b0[0]._M_dataplus._M_p = (pointer)&local_b0[0].field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar1,pcVar1 + secret->_M_string_length);
  ::std::__cxx11::string::append((char *)local_b0);
  FileSystem::JoinPath(local_130,&local_138,(string *)&this->secret_path,local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0[0]._M_dataplus._M_p != &local_b0[0].field_2) {
    operator_delete(local_b0[0]._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_M_erase(&(this->persistent_secrets)._M_h,secret);
  LocalFileSystem::RemoveFile
            ((LocalFileSystem *)&local_138,local_130,(optional_ptr<duckdb::FileOpener,_true>)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130[0]._M_dataplus._M_p != &local_130[0].field_2) {
    operator_delete(local_130[0]._M_dataplus._M_p);
  }
  FileSystem::~FileSystem(&local_138);
  return;
}

Assistant:

void LocalFileSecretStorage::RemoveSecret(const string &secret, OnEntryNotFound on_entry_not_found) {
	LocalFileSystem fs;
	string file = fs.JoinPath(secret_path, secret + ".duckdb_secret");
	persistent_secrets.erase(secret);
	try {
		fs.RemoveFile(file);
	} catch (std::exception &ex) {
		ErrorData error(ex);
		if (error.Type() == ExceptionType::IO) {
			throw IOException("Failed to remove secret file '%s', the file may have been removed by another duckdb "
			                  "instance. (original error: '%s')",
			                  file, error.RawMessage());
		}
		throw;
	}
}